

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O3

void __thiscall TApp_IniFlags_Test::TApp_IniFlags_Test(TApp_IniFlags_Test *this)

{
  string local_38;
  
  testing::Test::Test((Test *)this);
  (this->super_TApp).super_Test._vptr_Test = (_func_int **)&PTR__TApp_00171700;
  local_38.field_2._M_allocated_capacity._0_7_ = 0x7473655420794d;
  local_38.field_2._M_local_buf[7] = ' ';
  local_38.field_2._8_7_ = 0x6d6172676f7250;
  local_38._M_string_length = 0xf;
  local_38.field_2._M_local_buf[0xf] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  CLI::App::App(&(this->super_TApp).app,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (this->super_TApp).args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TApp).args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TApp).args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TApp).super_Test._vptr_Test = (_func_int **)&PTR__TApp_001711c0;
  return;
}

Assistant:

TEST_F(TApp, IniFlags) {
    TempFile tmpini{"TestIniTmp.ini"};
    app.set_config("--config", tmpini);

    {
        std::ofstream out{tmpini};
        out << "[default]" << std::endl;
        out << "two=2" << std::endl;
        out << "three=true" << std::endl;
        out << "four=on" << std::endl;
        out << "five" << std::endl;
    }

    int two;
    bool three, four, five;
    app.add_flag("--two", two);
    app.add_flag("--three", three);
    app.add_flag("--four", four);
    app.add_flag("--five", five);

    run();

    EXPECT_EQ(2, two);
    EXPECT_EQ(true, three);
    EXPECT_EQ(true, four);
    EXPECT_EQ(true, five);
}